

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O2

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::ResetCommandPool
          (VulkanLogicalDevice *this,VkCommandPool vkCmdPool,VkCommandPoolResetFlags flags)

{
  VkResult VVar1;
  string msg;
  string local_30;
  
  VVar1 = (*vkResetCommandPool)(this->m_VkDevice,vkCmdPool,flags);
  if (VVar1 != VK_SUCCESS) {
    Diligent::FormatString<char[29]>(&local_30,(char (*) [29])"Failed to reset command pool");
    Diligent::DebugAssertionFailed
              (local_30._M_dataplus._M_p,"ResetCommandPool",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x2c2);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return VVar1;
}

Assistant:

VkResult VulkanLogicalDevice::ResetCommandPool(VkCommandPool           vkCmdPool,
                                               VkCommandPoolResetFlags flags) const
{
    VkResult err = vkResetCommandPool(m_VkDevice, vkCmdPool, flags);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to reset command pool");
    return err;
}